

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::converter::ConvertFieldMaskPath
          (string *__return_storage_ptr__,converter *this,StringPiece path,
          ConverterCallback *converter)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  char *i;
  bool bVar7;
  StringPiece local_88;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 local_50 [8];
  StringPiece path_local;
  
  lVar4 = path.length_;
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50 = (undefined1  [8])this;
  path_local.ptr_ = path.ptr_;
  path_local.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  i = (char *)0x0;
  iVar5 = 0;
  bVar2 = false;
  bVar7 = false;
  pcVar6 = path.ptr_;
  do {
    if (bVar7) {
      if (i == pcVar6) {
        return (string *)path_local.length_;
      }
      StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
      std::__cxx11::string::push_back((char)path_local.length_);
      if (bVar2) {
        bVar7 = true;
      }
      else {
        cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
        bVar7 = true;
        if (cVar1 == '\\') {
          bVar2 = true;
          goto LAB_0030b249;
        }
        cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
        if (cVar1 == '\"') {
          iVar5 = (int)i + 1;
          bVar7 = false;
        }
      }
      bVar2 = false;
    }
    else {
      if ((((i == pcVar6) ||
           (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
           cVar1 == '.')) ||
          (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
          cVar1 == '(')) ||
         ((cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
          cVar1 == ')' ||
          (cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i),
          cVar1 == '\"')))) {
        local_88 = StringPiece::substr((StringPiece *)local_50,(long)iVar5,(long)i - (long)iVar5);
        if (*(long *)(lVar4 + 0x10) == 0) {
          uVar3 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined1 **)path_local.length_ != local_58) {
            operator_delete(*(undefined1 **)path_local.length_);
          }
          _Unwind_Resume(uVar3);
        }
        (**(code **)(lVar4 + 0x18))(local_78,lVar4,&local_88);
        std::__cxx11::string::_M_append((char *)path_local.length_,(ulong)local_78[0]);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        if (i < path_local.ptr_) {
          StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
          std::__cxx11::string::push_back((char)path_local.length_);
        }
        iVar5 = (int)i + 1;
      }
      if (i < path_local.ptr_) {
        cVar1 = StringPiece::operator[]((StringPiece *)local_50,(stringpiece_ssize_type)i);
        bVar7 = cVar1 == '\"';
      }
      else {
        bVar7 = false;
      }
    }
LAB_0030b249:
    i = i + 1;
    pcVar6 = path_local.ptr_;
    if (path_local.ptr_ < i) {
      return (string *)path_local.length_;
    }
  } while( true );
}

Assistant:

std::string ConvertFieldMaskPath(const StringPiece path,
                                 ConverterCallback converter) {
  std::string result;
  result.reserve(path.size() << 1);

  bool is_quoted = false;
  bool is_escaping = false;
  int current_segment_start = 0;

  // Loops until 1 passed the end of the input to make handling the last
  // segment easier.
  for (size_t i = 0; i <= path.size(); ++i) {
    // Outputs quoted string as-is.
    if (is_quoted) {
      if (i == path.size()) {
        break;
      }
      result.push_back(path[i]);
      if (is_escaping) {
        is_escaping = false;
      } else if (path[i] == '\\') {
        is_escaping = true;
      } else if (path[i] == '\"') {
        current_segment_start = i + 1;
        is_quoted = false;
      }
      continue;
    }
    if (i == path.size() || path[i] == '.' || path[i] == '(' ||
        path[i] == ')' || path[i] == '\"') {
      result += converter(
          path.substr(current_segment_start, i - current_segment_start));
      if (i < path.size()) {
        result.push_back(path[i]);
      }
      current_segment_start = i + 1;
    }
    if (i < path.size() && path[i] == '\"') {
      is_quoted = true;
    }
  }
  return result;
}